

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O2

SASL_MECHANISMS_HANDLE sasl_mechanisms_clone(SASL_MECHANISMS_HANDLE value)

{
  SASL_MECHANISMS_HANDLE __ptr;
  AMQP_VALUE pAVar1;
  
  __ptr = (SASL_MECHANISMS_HANDLE)malloc(8);
  if (__ptr != (SASL_MECHANISMS_HANDLE)0x0) {
    pAVar1 = amqpvalue_clone(value->composite_value);
    __ptr->composite_value = pAVar1;
    if (pAVar1 != (AMQP_VALUE)0x0) {
      return __ptr;
    }
    free(__ptr);
  }
  return (SASL_MECHANISMS_HANDLE)0x0;
}

Assistant:

SASL_MECHANISMS_HANDLE sasl_mechanisms_clone(SASL_MECHANISMS_HANDLE value)
{
    SASL_MECHANISMS_INSTANCE* sasl_mechanisms_instance = (SASL_MECHANISMS_INSTANCE*)malloc(sizeof(SASL_MECHANISMS_INSTANCE));
    if (sasl_mechanisms_instance != NULL)
    {
        sasl_mechanisms_instance->composite_value = amqpvalue_clone(((SASL_MECHANISMS_INSTANCE*)value)->composite_value);
        if (sasl_mechanisms_instance->composite_value == NULL)
        {
            free(sasl_mechanisms_instance);
            sasl_mechanisms_instance = NULL;
        }
    }

    return sasl_mechanisms_instance;
}